

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedConnection<tinyusdz::Token>::set(TypedConnection<tinyusdz::Token> *this,Path *p)

{
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(&this->_targetPaths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back(&this->_targetPaths,p);
  this->_authored = true;
  return;
}

Assistant:

void set(const Path &p) {
    _targetPaths.clear();
    _targetPaths.push_back(p);
    _authored = true;
  }